

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

void __thiscall
google::protobuf::io::CodedOutputStream::WriteVarint64(CodedOutputStream *this,uint64 value)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint64 uVar6;
  uint uVar7;
  uint uVar8;
  uint8 bytes [10];
  byte local_a [10];
  
  if (this->buffer_size_ < 10) {
    uVar5 = 0;
    if (0x7f < value) {
      uVar5 = 0;
      uVar6 = value;
      do {
        local_a[uVar5] = (byte)uVar6 | 0x80;
        uVar5 = uVar5 + 1;
        value = uVar6 >> 7;
        bVar2 = 0x3fff < uVar6;
        uVar6 = value;
      } while (bVar2);
    }
    local_a[uVar5 & 0xffffffff] = (byte)value;
    WriteRaw(this,local_a,(int)uVar5 + 1);
    return;
  }
  pbVar1 = this->buffer_;
  uVar8 = (uint)value;
  if (value >> 0x38 == 0) {
    uVar3 = (uint)(value >> 0x1c);
    if (uVar3 != 0) {
      if (0x3fff < uVar3) {
        uVar8 = 8;
        uVar4 = 7;
        if (0x1fffff < uVar3) goto LAB_0011fc59;
        goto LAB_0011fc69;
      }
      uVar4 = 6;
      uVar7 = 5;
      if (0x7f < uVar3) goto LAB_0011fc78;
      goto LAB_0011fc8a;
    }
    if (0x3fff < uVar8) {
      uVar3 = 3;
      uVar7 = 4;
      if (0x1fffff < uVar8) goto LAB_0011fc90;
      goto LAB_0011fc9e;
    }
    uVar3 = 2;
    uVar5 = 1;
    if (uVar8 < 0x80) goto LAB_0011fcb6;
  }
  else {
    uVar8 = 9;
    if ((long)value < 0) {
      pbVar1[9] = 0x81;
      uVar8 = 10;
    }
    pbVar1[8] = (byte)(value >> 0x38) | 0x80;
LAB_0011fc59:
    pbVar1[7] = (byte)(value >> 0x31) | 0x80;
    uVar4 = uVar8;
LAB_0011fc69:
    pbVar1[6] = (byte)(value >> 0x2a) | 0x80;
LAB_0011fc78:
    pbVar1[5] = (byte)(value >> 0x23) | 0x80;
    uVar7 = uVar4;
LAB_0011fc8a:
    pbVar1[4] = (byte)(value >> 0x1c) | 0x80;
LAB_0011fc90:
    uVar3 = uVar7;
    pbVar1[3] = (byte)(value >> 0x15) | 0x80;
LAB_0011fc9e:
    pbVar1[2] = (byte)(value >> 0xe) | 0x80;
  }
  pbVar1[1] = (byte)(value >> 7) | 0x80;
  uVar5 = (ulong)uVar3;
LAB_0011fcb6:
  *pbVar1 = (byte)value | 0x80;
  pbVar1[uVar5 - 1] = pbVar1[uVar5 - 1] & 0x7f;
  this->buffer_ = this->buffer_ + uVar5;
  this->buffer_size_ = this->buffer_size_ - (int)uVar5;
  return;
}

Assistant:

void CodedOutputStream::WriteVarint64(uint64 value) {
  if (buffer_size_ >= kMaxVarintBytes) {
    // Fast path:  We have enough bytes left in the buffer to guarantee that
    // this write won't cross the end, so we can skip the checks.
    uint8* target = buffer_;

    uint8* end = WriteVarint64ToArrayInline(value, target);
    int size = end - target;
    Advance(size);
  } else {
    // Slow path:  This write might cross the end of the buffer, so we
    // compose the bytes first then use WriteRaw().
    uint8 bytes[kMaxVarintBytes];
    int size = 0;
    while (value > 0x7F) {
      bytes[size++] = (static_cast<uint8>(value) & 0x7F) | 0x80;
      value >>= 7;
    }
    bytes[size++] = static_cast<uint8>(value) & 0x7F;
    WriteRaw(bytes, size);
  }
}